

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::DataPageHeader::DataPageHeader(DataPageHeader *this)

{
  Statistics *in_RDI;
  
  duckdb_apache::thrift::TBase::TBase((TBase *)in_RDI);
  *(undefined ***)in_RDI = &PTR__DataPageHeader_00c01960;
  *(undefined ***)in_RDI = &PTR__DataPageHeader_00c01960;
  *(undefined4 *)&in_RDI->max = 0;
  *(undefined4 *)&in_RDI->field_0xc = 0;
  *(undefined4 *)&in_RDI->field_0x10 = 0;
  *(undefined4 *)&in_RDI->field_0x14 = 0;
  Statistics::Statistics(in_RDI);
  _DataPageHeader__isset::_DataPageHeader__isset((_DataPageHeader__isset *)&in_RDI[1].field_0x18);
  return;
}

Assistant:

DataPageHeader::DataPageHeader() noexcept
   : num_values(0),
     encoding(static_cast<Encoding::type>(0)),
     definition_level_encoding(static_cast<Encoding::type>(0)),
     repetition_level_encoding(static_cast<Encoding::type>(0)) {
}